

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_widget.cpp
# Opt level: O0

void __thiscall nesvis::PpuWidget::draw_sprites(PpuWidget *this)

{
  bool bVar1;
  bool bVar2;
  PpuRegisters *pPVar3;
  reference texture;
  Vector2<float> local_54;
  int local_4c;
  int modified_tile_index;
  Sprite SStack_45;
  Sprite sprite;
  uint8_t index;
  int sprite_pattern_table;
  undefined8 uStack_2e;
  PpuRegisters reg;
  PpuWidget *this_local;
  
  reg._22_8_ = this;
  pPVar3 = n_e_s::nes::Nes::ppu_registers(this->nes_);
  uStack_2e._0_2_ = pPVar3->scanline;
  uStack_2e._2_2_ = pPVar3->cycle;
  uStack_2e._4_1_ = pPVar3->ctrl;
  uStack_2e._5_1_ = pPVar3->mask;
  uStack_2e._6_1_ = pPVar3->status;
  uStack_2e._7_1_ = pPVar3->oamaddr;
  reg._0_8_ = *(undefined8 *)&pPVar3->fine_x_scroll;
  reg._8_8_ = *(undefined8 *)&pPVar3->name_table_latch;
  reg._16_4_ = *(undefined4 *)&pPVar3->attribute_table_latch;
  reg.pattern_table_shifter_low = pPVar3->attribute_table_shifter_hi;
  bVar1 = n_e_s::core::Register<unsigned_char>::is_set
                    ((Register<unsigned_char> *)((long)&sprite_pattern_table + 2),3);
  ImGui::Text("%s: %i","Sprite pattern table: ",(ulong)(uint)bVar1);
  ImVec2::ImVec2((ImVec2 *)&sprite.y,0.0,0.0);
  ImGui::PushStyleVar(0xe,(ImVec2 *)&sprite.y);
  for (sprite.x = '\0'; sprite.x < 0x40; sprite.x = sprite.x + '\x01') {
    SStack_45 = PpuHelper::get_sprite(this->ppu_helper_,sprite.x);
    local_4c = (uint)modified_tile_index._1_1_ + (uint)bVar1 * 0x100;
    if ((uint)sprite.x % 8 != 0) {
      ImGui::SameLine(0.0,-1.0);
    }
    texture = std::array<sf::Texture,_512UL>::operator[]
                        (&this->pattern_table_textures_,(long)local_4c);
    sf::Vector2<float>::Vector2(&local_54,16.0,16.0);
    ImGui::Image(texture,&local_54,(Color *)&sf::Color::White,(Color *)&sf::Color::Transparent);
    bVar2 = ImGui::IsItemHovered(0);
    if (bVar2) {
      ImGui::BeginTooltip();
      ImGui::Text("Index: %02hhX",(ulong)sprite.x);
      ImGui::Text("x: %hhu",(ulong)SStack_45 & 0xff);
      ImGui::Text("y: %hhu",(ulong)SStack_45 >> 8 & 0xff);
      ImGui::Text("Palette: %02hhX",(ulong)SStack_45 >> 0x20 & 0xff);
      ImGui::EndTooltip();
    }
  }
  ImGui::PopStyleVar(1);
  return;
}

Assistant:

void PpuWidget::draw_sprites() {
    const auto reg = nes_->ppu_registers();
    const int sprite_pattern_table = reg.ctrl.is_set(3u) ? 1 : 0;
    ImGui::Text("%s: %i", "Sprite pattern table: ", sprite_pattern_table);
    ImGui::PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(0, 0));
    for (uint8_t index = 0; index < 64; ++index) {
        const auto sprite = ppu_helper_->get_sprite(index);
        const int modified_tile_index =
                sprite.tile_index + kPatternTableSize * sprite_pattern_table;

        if (index % 8 != 0) {
            ImGui::SameLine();
        }
        ImGui::Image(pattern_table_textures_[modified_tile_index],
                {kSpriteSize, kSpriteSize});
        if (ImGui::IsItemHovered()) {
            ImGui::BeginTooltip();
            ImGui::Text("Index: %02hhX", index);
            ImGui::Text("x: %hhu", sprite.x);
            ImGui::Text("y: %hhu", sprite.y);
            ImGui::Text("Palette: %02hhX", sprite.palette);
            ImGui::EndTooltip();
        }
    }
    ImGui::PopStyleVar(1);
}